

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall
Board::PopulateBoard
          (Board *this,vector<Cord,_std::allocator<Cord>_> *cords,int fromTop,int fromleft)

{
  int iVar1;
  pointer pCVar2;
  int iVar3;
  ulong uVar4;
  
  pCVar2 = (cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pCVar2) {
    uVar4 = 0;
    do {
      iVar3 = pCVar2[uVar4].x + fromTop + 10;
      iVar1 = pCVar2[uVar4].y + fromleft + 10;
      Cell::SetNextState(this->boardWorld[iVar3] + iVar1,FILLED);
      Cell::Increment(this->boardWorld[iVar3] + iVar1);
      uVar4 = uVar4 + 1;
      pCVar2 = (cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pCVar2 >> 3));
  }
  return;
}

Assistant:

void Board::PopulateBoard(std::vector<Cord> const & cords, int fromTop, int fromleft)
{
    for(int i = 0; i < cords.size(); i++)
    {
        int x = cords[i].x + MARGIN + fromTop;
        int y = cords[i].y + MARGIN + fromleft;

        boardWorld[x][y].SetNextState(CellState::FILLED);
        boardWorld[x][y].Increment();
    }
}